

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsUtils.cpp
# Opt level: O1

PropertyName Js::ParserWrapper::FunctionName(ParseNode *node)

{
  ParseNodeVar *pPVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeFnc *pPVar4;
  undefined4 *puVar5;
  
  if (node->nop == knopFncDecl) {
    pPVar4 = ParseNode::AsParseNodeFnc(node);
    pPVar1 = pPVar4->pnodeName;
    if (pPVar1 != (ParseNodeVar *)0x0) {
      if ((pPVar1->super_ParseNode).nop != knopVarDecl) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                    ,0x5c,"(function->pnodeName->nop == knopVarDecl)",
                                    "function->pnodeName->nop == knopVarDecl");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pPVar4 = (ParseNodeFnc *)pPVar4->pnodeName->pid;
    }
    if (pPVar1 != (ParseNodeVar *)0x0) {
      return (PropertyName)pPVar4;
    }
  }
  return (PropertyName)0x0;
}

Assistant:

PropertyName ParserWrapper::FunctionName( ParseNode *node )
    {
        if( node->nop == knopFncDecl )
        {
            ParseNodeFnc * function = node->AsParseNodeFnc();
            if(function->pnodeName)
            {
                Assert(function->pnodeName->nop == knopVarDecl);
                return function->pnodeName->pid;
            }
        }
        return nullptr;
    }